

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMDetector.cpp
# Opt level: O0

ResultPointsAndTransitions *
ZXing::DataMatrix::TransitionsBetween(BitMatrix *image,ResultPoint *from,ResultPoint *to)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ResultPoint *in_RCX;
  ResultPoint *in_RDX;
  ResultPointsAndTransitions *in_RDI;
  float fVar9;
  bool isBlack;
  int y;
  int x;
  bool inBlack;
  int transitions;
  int xstep;
  int ystep;
  int error;
  int dy;
  int dx;
  bool steep;
  int toY;
  int toX;
  int fromY;
  int fromX;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  int x_00;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int local_50;
  int local_4c;
  bool local_45;
  int local_44;
  int local_38;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  ResultPoint *local_18;
  ResultPoint *local_10;
  
  local_18 = in_RCX;
  local_10 = in_RDX;
  fVar9 = ResultPoint::x(in_RDX);
  local_1c = (int)fVar9;
  fVar9 = ResultPoint::y(local_10);
  local_20 = (int)fVar9;
  fVar9 = ResultPoint::x(local_18);
  local_24 = (int)fVar9;
  fVar9 = ResultPoint::y(local_18);
  local_28 = (int)fVar9;
  iVar3 = local_28 - local_20;
  if (iVar3 < 1) {
    iVar3 = -iVar3;
  }
  iVar8 = local_24 - local_1c;
  if (iVar8 < 1) {
    iVar8 = -iVar8;
  }
  if (iVar8 < iVar3) {
    std::swap<int>(&local_1c,&local_20);
    std::swap<int>(&local_24,&local_28);
  }
  iVar4 = local_24 - local_1c;
  if (iVar4 < 1) {
    iVar4 = -iVar4;
  }
  iVar5 = local_28 - local_20;
  if (iVar5 < 1) {
    iVar5 = -iVar5;
  }
  local_38 = -iVar4 / 2;
  iVar6 = -1;
  if (local_20 < local_28) {
    iVar6 = 1;
  }
  iVar7 = -1;
  if (local_1c < local_24) {
    iVar7 = 1;
  }
  local_44 = 0;
  local_45 = BitMatrix::get((BitMatrix *)
                            CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                            in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
  local_50 = local_20;
  for (local_4c = local_1c; local_4c != local_24; local_4c = iVar7 + local_4c) {
    x_00 = local_50;
    iVar1 = local_4c;
    if (iVar8 < iVar3) {
      x_00 = local_4c;
      iVar1 = local_50;
    }
    bVar2 = BitMatrix::get((BitMatrix *)CONCAT44(iVar1,iVar1),x_00,in_stack_ffffffffffffff68);
    if (bVar2 != local_45) {
      local_44 = local_44 + 1;
      local_45 = bVar2;
    }
    local_38 = iVar5 + local_38;
    if (0 < local_38) {
      if (local_50 == local_28) break;
      local_50 = iVar6 + local_50;
      local_38 = local_38 - iVar4;
    }
  }
  in_RDI->from = local_10;
  in_RDI->to = local_18;
  in_RDI->transitions = local_44;
  return in_RDI;
}

Assistant:

static ResultPointsAndTransitions TransitionsBetween(const BitMatrix& image, const ResultPoint& from,
													 const ResultPoint& to)
{
	// See QR Code Detector, sizeOfBlackWhiteBlackRun()
	int fromX = static_cast<int>(from.x());
	int fromY = static_cast<int>(from.y());
	int toX = static_cast<int>(to.x());
	int toY = static_cast<int>(to.y());
	bool steep = std::abs(toY - fromY) > std::abs(toX - fromX);
	if (steep) {
		std::swap(fromX, fromY);
		std::swap(toX, toY);
	}

	int dx = std::abs(toX - fromX);
	int dy = std::abs(toY - fromY);
	int error = -dx / 2;
	int ystep = fromY < toY ? 1 : -1;
	int xstep = fromX < toX ? 1 : -1;
	int transitions = 0;
	bool inBlack = image.get(steep ? fromY : fromX, steep ? fromX : fromY);
	for (int x = fromX, y = fromY; x != toX; x += xstep) {
		bool isBlack = image.get(steep ? y : x, steep ? x : y);
		if (isBlack != inBlack) {
			transitions++;
			inBlack = isBlack;
		}
		error += dy;
		if (error > 0) {
			if (y == toY) {
				break;
			}
			y += ystep;
			error -= dx;
		}
	}
	return ResultPointsAndTransitions{ &from, &to, transitions };
}